

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bcon-basic.c
# Opt level: O1

void test_append_ctx(void)

{
  char extraout_AL;
  int iVar1;
  uint uVar2;
  uint uVar3;
  void *__buf;
  void *__buf_00;
  void *pvVar4;
  void *pvVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  ulong uVar8;
  uint32_t uVar9;
  long lVar10;
  char *pcVar11;
  char *pcVar12;
  bson_t *pbVar13;
  undefined8 extraout_XMM1_Qa;
  undefined8 uVar14;
  bson_t bcon;
  bson_t expected;
  bson_t child;
  undefined8 uStack_68d0;
  uint8_t *puStack_68c8;
  undefined1 *puStack_68c0;
  undefined1 auStack_68b0 [8];
  void *pvStack_68a8;
  undefined8 uStack_6898;
  undefined8 uStack_6890;
  char *pcStack_6888;
  undefined8 uStack_6870;
  undefined1 auStack_6800 [25944];
  void *pvStack_2a8;
  char *pcStack_2a0;
  char *pcStack_298;
  char *pcStack_290;
  code *pcStack_288;
  bson_t local_280;
  undefined1 local_200 [4];
  uint local_1fc;
  undefined1 local_180 [336];
  
  pbVar13 = &local_280;
  pcStack_288 = (code *)0x13ae4b;
  bson_init(&local_280);
  pcStack_288 = (code *)0x13ae5b;
  bson_init(local_200);
  pcStack_288 = (code *)0x13ae6b;
  bson_init(local_180);
  pcStack_288 = (code *)0x13ae8c;
  bson_append_utf8(local_180,"c",0xffffffff,"d",0xffffffff);
  pcStack_288 = (code *)0x13aeb3;
  bson_append_utf8(local_180,"e",0xffffffff,"f",0xffffffff);
  pcStack_288 = (code *)0x13aecd;
  bson_append_document(local_200,"a",0xffffffff,local_180);
  pcVar12 = "e";
  pcStack_290 = (char *)0x0;
  pcStack_298 = "}";
  pcStack_2a0 = "f";
  pvStack_2a8 = (void *)0x13af02;
  test_append_ctx_helper(&local_280,"a","{",0,"add magic");
  pcStack_288 = (code *)0x13af11;
  __buf = (void *)bson_get_data(&local_280);
  pcStack_288 = (code *)0x13af1c;
  __buf_00 = (void *)bson_get_data(local_200);
  if (local_1fc == local_280.len) {
    pcStack_288 = (code *)0x13af3a;
    pvVar4 = (void *)bson_get_data(local_200);
    pcStack_288 = (code *)0x13af45;
    pvVar5 = (void *)bson_get_data(&local_280);
    pcStack_288 = (code *)0x13af54;
    iVar1 = bcmp(pvVar4,pvVar5,(ulong)local_1fc);
    if (iVar1 == 0) {
      pcStack_288 = (code *)0x13af60;
      bson_destroy(&local_280);
      pcStack_288 = (code *)0x13af6d;
      bson_destroy(local_200);
      pcStack_288 = (code *)0x13af7a;
      bson_destroy(local_180);
      return;
    }
  }
  pcStack_288 = (code *)0x13af96;
  uVar6 = bson_as_canonical_extended_json(&local_280,0);
  pcStack_288 = (code *)0x13afab;
  uVar7 = bson_as_canonical_extended_json(local_200,0);
  uVar9 = local_1fc;
  if (local_280.len < local_1fc) {
    uVar9 = local_280.len;
  }
  if (uVar9 != 0) {
    uVar9 = local_1fc;
    if (local_280.len <= local_1fc) {
      uVar9 = local_280.len;
    }
    lVar10 = 0;
    do {
      if (*(char *)((long)__buf + lVar10) != *(char *)((long)__buf_00 + lVar10)) {
        uVar2 = (uint)lVar10;
        goto LAB_0013afe4;
      }
      lVar10 = lVar10 + 1;
    } while (uVar9 != (uint)lVar10);
  }
  uVar2 = 0xffffffff;
LAB_0013afe4:
  uVar3 = local_280.len;
  if (local_280.len < local_1fc) {
    uVar3 = local_1fc;
  }
  uVar3 = uVar3 - 1;
  if (uVar2 != 0xffffffff) {
    uVar3 = uVar2;
  }
  pcStack_288 = (code *)0x13b00f;
  uVar14 = extraout_XMM1_Qa;
  fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",(ulong)uVar3);
  pcStack_288 = (code *)0x13b027;
  uVar2 = open("failure.bad.bson",0x42,0x1a0);
  pcVar11 = "failure.expected.bson";
  pvVar4 = (void *)0x42;
  pcStack_288 = (code *)0x13b042;
  uVar3 = open("failure.expected.bson",0x42,0x1a0);
  if (uVar2 == 0xffffffff) {
LAB_0013b08e:
    pcStack_288 = (code *)0x13b093;
    test_append_ctx_cold_5();
LAB_0013b093:
    pcStack_288 = (code *)0x13b098;
    test_append_ctx_cold_4();
  }
  else {
    pbVar13 = (bson_t *)(ulong)uVar3;
    if (uVar3 == 0xffffffff) goto LAB_0013b093;
    pcVar11 = (char *)(ulong)uVar2;
    pcStack_288 = (code *)0x13b063;
    pvVar4 = __buf;
    uVar8 = write(uVar2,__buf,(ulong)local_280.len);
    if (uVar8 == local_280.len) {
      __buf = (void *)(ulong)local_1fc;
      pcStack_288 = (code *)0x13b07e;
      pvVar4 = __buf_00;
      pcVar11 = (char *)pbVar13;
      pvVar5 = (void *)write(uVar3,__buf_00,(size_t)__buf);
      if (pvVar5 != __buf) goto LAB_0013b09d;
      pvVar4 = (void *)(ulong)uVar3;
      pcStack_288 = (code *)0x13b08e;
      pcVar11 = (char *)(ulong)uVar2;
      test_append_ctx_cold_3();
      goto LAB_0013b08e;
    }
  }
  pcStack_288 = (code *)0x13b09d;
  test_append_ctx_cold_1();
LAB_0013b09d:
  pcStack_288 = test_append_ctx_helper;
  test_append_ctx_cold_2();
  puStack_68c0 = auStack_68b0;
  if (extraout_AL != '\0') {
    uStack_6870 = uVar14;
  }
  pvStack_68a8 = pvVar4;
  uStack_6898 = uVar6;
  uStack_6890 = uVar7;
  pcStack_6888 = pcVar12;
  pvStack_2a8 = __buf_00;
  pcStack_2a0 = (char *)pbVar13;
  pcStack_298 = (char *)__buf;
  pcStack_290 = (char *)(ulong)uVar2;
  pcStack_288 = (code *)&stack0xfffffffffffffff8;
  bcon_append_ctx_init(auStack_6800);
  puStack_68c8 = local_280.padding;
  uStack_68d0 = 0x3000000008;
  bcon_append_ctx_va(pcVar11,auStack_6800,&uStack_68d0);
  if ((uint)uStack_68d0 < 0x29) {
    uStack_68d0 = CONCAT44(uStack_68d0._4_4_,(uint)uStack_68d0 + 8);
  }
  else {
    puStack_68c8 = puStack_68c8 + 8;
  }
  bcon_append_ctx(pcVar11,auStack_6800,"c","d",0);
  bcon_append_ctx_va(pcVar11,auStack_6800,&uStack_68d0);
  return;
}

Assistant:

static void
test_append_ctx (void)
{
   bson_t bcon, expected, child;

   bson_init (&bcon);
   bson_init (&expected);
   bson_init (&child);

   bson_append_utf8 (&child, "c", -1, "d", -1);
   bson_append_utf8 (&child, "e", -1, "f", -1);

   bson_append_document (&expected, "a", -1, &child);

   test_append_ctx_helper (
      &bcon, "a", "{", NULL, "add magic", "e", "f", "}", NULL);

   bson_eq_bson (&bcon, &expected);

   bson_destroy (&bcon);
   bson_destroy (&expected);
   bson_destroy (&child);
}